

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O0

void __thiscall HostUI::event(HostUI *this,SDL_Event *event)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  float local_70;
  float local_68;
  ImVec2 IStack_50;
  int key;
  ImVec2 local_48;
  int local_40;
  int local_3c;
  int display_h;
  int display_w;
  f32 h;
  f32 w;
  int ih;
  int iw;
  ImGuiIO *io_1;
  ImGuiIO *io;
  SDL_Event *event_local;
  HostUI *this_local;
  
  io = (ImGuiIO *)event;
  event_local = (SDL_Event *)this;
  io_1 = ImGui::GetIO();
  iVar2 = io->ConfigFlags;
  if (iVar2 == 0x200) {
    cVar1 = *(char *)&(io->DisplaySize).y;
    if ((cVar1 == '\x01') || (cVar1 == '\x06')) {
      _ih = ImGui::GetIO();
      SDL_GetWindowSize(this->window,&w,&h);
      display_w = (int)(float)(int)w;
      display_h = (int)(float)(int)h;
      SDL_GL_GetDrawableSize(this->window,&local_3c,&local_40);
      ImVec2::ImVec2(&local_48,(float)display_w,(float)display_h);
      _ih->DisplaySize = local_48;
      if ((float)display_w <= 0.0) {
        local_68 = 0.0;
      }
      else {
        local_68 = (float)local_3c / (float)display_w;
      }
      if ((float)display_h <= 0.0) {
        local_70 = 0.0;
      }
      else {
        local_70 = (float)local_40 / (float)display_h;
      }
      ImVec2::ImVec2(&stack0xffffffffffffffb0,local_68,local_70);
      _ih->DisplayFramebufferScale = IStack_50;
      memset(this->proj_matrix,0,0x24);
      this->proj_matrix[0] = (f32)(2.0 / (float)display_w);
      this->proj_matrix[4] = (f32)(-2.0 / (float)display_h);
      this->proj_matrix[6] = -1.0;
      this->proj_matrix[7] = 1.0;
      this->proj_matrix[8] = 1.0;
    }
  }
  else if (iVar2 - 0x300U < 2) {
    io_1->KeysDown[(int)io->DeltaTime] = io->ConfigFlags == 0x300;
    uVar3 = SDL_GetModState();
    io_1->KeyShift = (uVar3 & 3) != 0;
    uVar3 = SDL_GetModState();
    io_1->KeyCtrl = (uVar3 & 0xc0) != 0;
    uVar3 = SDL_GetModState();
    io_1->KeyAlt = (uVar3 & 0x300) != 0;
    uVar3 = SDL_GetModState();
    io_1->KeySuper = (uVar3 & 0xc00) != 0;
  }
  else if (iVar2 == 0x303) {
    ImGuiIO::AddInputCharactersUTF8(io_1,(char *)&(io->DisplaySize).y);
  }
  else if (iVar2 == 0x401) {
    if (*(char *)&io->DeltaTime == '\x01') {
      this->mouse_pressed[0] = 1.0;
    }
    if (*(char *)&io->DeltaTime == '\x03') {
      this->mouse_pressed[1] = 1.0;
    }
    if (*(char *)&io->DeltaTime == '\x02') {
      this->mouse_pressed[2] = 1.0;
    }
  }
  else if (iVar2 == 0x403) {
    if (0 < (int)io->IniSavingRate) {
      this->mouse_wheel = 1.0;
    }
    if ((int)io->IniSavingRate < 0) {
      this->mouse_wheel = -1.0;
    }
  }
  return;
}

Assistant:

void HostUI::event(union SDL_Event* event) {
  ImGuiIO& io = ImGui::GetIO();
  switch (event->type) {
    case SDL_WINDOWEVENT:
      switch (event->window.event) {
        case SDL_WINDOWEVENT_SHOWN:
        case SDL_WINDOWEVENT_SIZE_CHANGED: {
          ImGuiIO& io = ImGui::GetIO();

          int iw, ih;
          SDL_GetWindowSize(window, &iw, &ih);
          f32 w = iw, h = ih;
          int display_w, display_h;
          SDL_GL_GetDrawableSize(window, &display_w, &display_h);
          io.DisplaySize = ImVec2(w, h);
          io.DisplayFramebufferScale =
              ImVec2(w > 0 ? (display_w / w) : 0, h > 0 ? (display_h / h) : 0);

          memset(proj_matrix, 0, sizeof(proj_matrix));
          proj_matrix[0] = 2.0f / w;
          proj_matrix[4] = -2.0f / h;
          proj_matrix[6] = -1.0f;
          proj_matrix[7] = 1.0f;
          proj_matrix[8] = 1.0f;
          break;
        }
      }
      break;
    case SDL_MOUSEWHEEL:
      if (event->wheel.y > 0) mouse_wheel = 1;
      if (event->wheel.y < 0) mouse_wheel = -1;
      break;
    case SDL_MOUSEBUTTONDOWN:
      if (event->button.button == SDL_BUTTON_LEFT) mouse_pressed[0] = true;
      if (event->button.button == SDL_BUTTON_RIGHT) mouse_pressed[1] = true;
      if (event->button.button == SDL_BUTTON_MIDDLE) mouse_pressed[2] = true;
      break;
    case SDL_TEXTINPUT:
      io.AddInputCharactersUTF8(event->text.text);
      break;
    case SDL_KEYDOWN:
    case SDL_KEYUP: {
      int key = event->key.keysym.scancode;
      io.KeysDown[key] = (event->type == SDL_KEYDOWN);
      io.KeyShift = ((SDL_GetModState() & KMOD_SHIFT) != 0);
      io.KeyCtrl = ((SDL_GetModState() & KMOD_CTRL) != 0);
      io.KeyAlt = ((SDL_GetModState() & KMOD_ALT) != 0);
      io.KeySuper = ((SDL_GetModState() & KMOD_GUI) != 0);
      break;
    }
  }
}